

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

int google::RUN_ALL_TESTS(void)

{
  FILE *__stream;
  bool bVar1;
  reference pp_Var2;
  size_type sVar3;
  __normal_iterator<void_(**)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_> local_28;
  __normal_iterator<void_(**)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_> local_20;
  _func_void **local_18;
  __normal_iterator<void_(*const_*)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
  local_10;
  const_iterator it;
  
  __gnu_cxx::
  __normal_iterator<void_(*const_*)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>::
  __normal_iterator(&local_10);
  local_20._M_current =
       (_func_void **)
       std::vector<void_(*)(),_std::allocator<void_(*)()>_>::begin
                 ((vector<void_(*)(),_std::allocator<void_(*)()>_> *)g_testlist);
  __gnu_cxx::__normal_iterator<void(*const*)(),std::vector<void(*)(),std::allocator<void(*)()>>>::
  __normal_iterator<void(**)()>
            ((__normal_iterator<void(*const*)(),std::vector<void(*)(),std::allocator<void(*)()>>> *)
             &local_18,&local_20);
  local_10._M_current = local_18;
  while( true ) {
    local_28._M_current =
         (_func_void **)
         std::vector<void_(*)(),_std::allocator<void_(*)()>_>::end
                   ((vector<void_(*)(),_std::allocator<void_(*)()>_> *)g_testlist);
    bVar1 = __gnu_cxx::operator!=(&local_10,&local_28);
    __stream = _stderr;
    if (!bVar1) break;
    pp_Var2 = __gnu_cxx::
              __normal_iterator<void_(*const_*)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
              ::operator*(&local_10);
    (**pp_Var2)();
    __gnu_cxx::
    __normal_iterator<void_(*const_*)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>::
    operator++(&local_10);
  }
  sVar3 = std::vector<void_(*)(),_std::allocator<void_(*)()>_>::size
                    ((vector<void_(*)(),_std::allocator<void_(*)()>_> *)g_testlist);
  fprintf(__stream,"Passed %d tests\n\nPASS\n",sVar3 & 0xffffffff);
  return 0;
}

Assistant:

static inline int RUN_ALL_TESTS() {
  vector<void (*)()>::const_iterator it;
  for (it = g_testlist.begin(); it != g_testlist.end(); ++it) {
    (*it)();
  }
  fprintf(stderr, "Passed %d tests\n\nPASS\n", (int)g_testlist.size());
  return 0;
}